

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

floatx80 addFloatx80Sigs(floatx80 a,floatx80 b,flag zSign)

{
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 fVar1;
  floatx80 fVar2;
  int local_6c;
  bits64 bStack_68;
  int32 expDiff;
  bits64 zSig1;
  bits64 zSig0;
  bits64 bSig;
  bits64 aSig;
  int32 zExp;
  int32 bExp;
  int32 aExp;
  flag zSign_local;
  floatx80 b_local;
  floatx80 a_local;
  bits64 local_10;
  
  b_local._0_8_ = b.low;
  a_00.low = a.low;
  a_00.high = a.high;
  aExp._0_2_ = b.high;
  a_00._2_6_ = 0;
  bExp._3_1_ = zSign;
  b_local.low._0_2_ = a_00.high;
  bSig = extractFloatx80Frac(a_00);
  a_01._2_6_ = 0;
  a_01.high = (ushort)b_local.low;
  a_01.low = a_00.low;
  zExp = extractFloatx80Exp(a_01);
  a_02._2_6_ = 0;
  a_02.high = (bits16)aExp;
  a_02.low = b_local._0_8_;
  zSig0 = extractFloatx80Frac(a_02);
  a_03._2_6_ = 0;
  a_03.high = (bits16)aExp;
  a_03.low = b_local._0_8_;
  aSig._4_4_ = extractFloatx80Exp(a_03);
  local_6c = zExp - aSig._4_4_;
  if (local_6c < 1) {
    if (local_6c < 0) {
      if (aSig._4_4_ == 0x7fff) {
        if ((zSig0 & 0x7fffffffffffffff) == 0) {
          fVar1 = packFloatx80(bExp._3_1_,0x7fff,0x8000000000000000);
          a_local.low._0_2_ = fVar1.high;
        }
        else {
          a_05._2_6_ = 0;
          a_05.high = (ushort)b_local.low;
          b_01._2_6_ = 0;
          b_01.high = (bits16)aExp;
          a_05.low = a_00.low;
          b_01.low = b_local._0_8_;
          fVar1 = propagateFloatx80NaN(a_05,b_01);
          a_local.low._0_2_ = fVar1.high;
        }
        goto LAB_005654cf;
      }
      if (zExp == 0) {
        local_6c = local_6c + 1;
      }
      shift64ExtraRightJamming(bSig,0,-(short)local_6c,&bSig,&stack0xffffffffffffff98);
      aSig._0_4_ = aSig._4_4_;
      goto LAB_0056545a;
    }
    if (zExp == 0x7fff) {
      if (((bSig | zSig0) & 0x7fffffffffffffff) == 0) {
        a_local.low._0_2_ = (ushort)b_local.low;
        fVar1.low = a_00.low;
        fVar1._0_8_ = a_00.low;
      }
      else {
        a_06._2_6_ = 0;
        a_06.high = (ushort)b_local.low;
        b_02._2_6_ = 0;
        b_02.high = (bits16)aExp;
        a_06.low = a_00.low;
        b_02.low = b_local._0_8_;
        fVar1 = propagateFloatx80NaN(a_06,b_02);
        a_local.low._0_2_ = fVar1.high;
      }
      goto LAB_005654cf;
    }
    bStack_68 = 0;
    zSig1 = bSig + zSig0;
    if (zExp != 0) {
      aSig._0_4_ = zExp;
      goto LAB_00565471;
    }
    normalizeFloatx80Subnormal(zSig1,(int32 *)&aSig,&zSig1);
  }
  else {
    if (zExp == 0x7fff) {
      if ((bSig & 0x7fffffffffffffff) == 0) {
        a_local.low._0_2_ = (ushort)b_local.low;
        fVar1.low = a_00.low;
        fVar1._0_8_ = a_00.low;
      }
      else {
        a_04._2_6_ = 0;
        a_04.high = (ushort)b_local.low;
        b_00._2_6_ = 0;
        b_00.high = (bits16)aExp;
        a_04.low = a_00.low;
        b_00.low = b_local._0_8_;
        fVar1 = propagateFloatx80NaN(a_04,b_00);
        a_local.low._0_2_ = fVar1.high;
      }
      goto LAB_005654cf;
    }
    if (aSig._4_4_ == 0) {
      local_6c = local_6c + -1;
    }
    shift64ExtraRightJamming(zSig0,0,(int16)local_6c,&zSig0,&stack0xffffffffffffff98);
    aSig._0_4_ = zExp;
LAB_0056545a:
    zSig1 = bSig + zSig0;
    if (-1 < (long)zSig1) {
LAB_00565471:
      shift64ExtraRightJamming(zSig1,bStack_68,1,&zSig1,&stack0xffffffffffffff98);
      zSig1 = zSig1 | 0x8000000000000000;
      aSig._0_4_ = (int)aSig + 1;
    }
  }
  fVar1 = roundAndPackFloatx80(floatx80_rounding_precision,bExp._3_1_,(int)aSig,zSig1,bStack_68);
  a_local.low._0_2_ = fVar1.high;
LAB_005654cf:
  local_10 = fVar1.low;
  fVar2._2_6_ = fVar1._2_6_;
  fVar2.high = (bits16)a_local.low;
  fVar2.low = local_10;
  return fVar2;
}

Assistant:

static floatx80 addFloatx80Sigs( floatx80 a, floatx80 b, flag zSign )
{
	int32 aExp, bExp, zExp;
	bits64 aSig, bSig, zSig0, zSig1;
	int32 expDiff;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	bSig = extractFloatx80Frac( b );
	bExp = extractFloatx80Exp( b );
	expDiff = aExp - bExp;
	if ( 0 < expDiff ) {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( aSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return a;
		}
		if ( bExp == 0 ) --expDiff;
		shift64ExtraRightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
		zExp = aExp;
	}
	else if ( expDiff < 0 ) {
		if ( bExp == 0x7FFF ) {
			if ( (bits64) ( bSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
		}
		if ( aExp == 0 ) ++expDiff;
		shift64ExtraRightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
		zExp = bExp;
	}
	else {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( ( aSig | bSig )<<1 ) ) {
				return propagateFloatx80NaN( a, b );
			}
			return a;
		}
		zSig1 = 0;
		zSig0 = aSig + bSig;
		if ( aExp == 0 ) {
			normalizeFloatx80Subnormal( zSig0, &zExp, &zSig0 );
			goto roundAndPack;
		}
		zExp = aExp;
		goto shiftRight1;
	}
	zSig0 = aSig + bSig;
	if ( (sbits64) zSig0 < 0 ) goto roundAndPack;
	shiftRight1:
	shift64ExtraRightJamming( zSig0, zSig1, 1, &zSig0, &zSig1 );
	zSig0 |= LIT64( 0x8000000000000000 );
	++zExp;
	roundAndPack:
	return
		roundAndPackFloatx80(
			floatx80_rounding_precision, zSign, zExp, zSig0, zSig1 );

}